

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O3

void __thiscall bal::Cnf::transaction_begin(Cnf *this)

{
  container_size_t cVar1;
  
  if (this->immutable_offset_ != 0) {
    __assert_fail("immutable_offset_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.cpp"
                  ,0x4b,"void bal::Cnf::transaction_begin()");
  }
  cVar1 = (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
          super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
          .
          super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
          .transaction_size_;
  this->immutable_offset_ = (this->clauses_).size_;
  if (cVar1 == 0xffffffff) {
    (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
    super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
    .
    super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
    .transaction_size_ =
         (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
         super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
         .
         super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
         .super_Container<bal::avl_tree_index_item_t>.size_;
    (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
    super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
    .
    super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
    .transaction_container_size_ =
         ((this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
          super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
          .
          super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
         .container_)->size_;
    (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
    super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
    .
    super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
    .transaction_instances_size_ =
         (this->l0_index_).super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>.
         super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
         .
         super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
         .instances_.size_;
    return;
  }
  __assert_fail("transaction_size_ == CONTAINER_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/containerindex.hpp"
                ,0x56,
                "void bal::ContainerIndex<bal::avl_tree_index_item_t, unsigned int, bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t, unsigned int, bal::avl_tree_insertion_point_t>, bal::avl_tree_insertion_point_t>::transaction_begin() [INDEX_DATA_T = bal::avl_tree_index_item_t, CONTAINER_DATA_T = unsigned int, INSTANCE_ITERATOR_T = bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t, unsigned int, bal::avl_tree_insertion_point_t>, INSERTION_POINT_T = bal::avl_tree_insertion_point_t]"
               );
}

Assistant:

void Cnf::transaction_begin() {
        assert(immutable_offset_ == 0);
        immutable_offset_ = clauses_.size_;
        l0_index_.transaction_begin();
    }